

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateEndStructMethod
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  IdlNamer *this_00;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> returns;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> field_vec;
  string name;
  anon_class_24_3_5a821194 local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&returns,"end",(allocator<char> *)&local_d8);
  this_00 = &this->namer_;
  Namer::Method(&name,&this_00->super_Namer,&returns,(string *)struct_def);
  std::__cxx11::string::~string((string *)&returns);
  (*(this_00->super_Namer)._vptr_Namer[0xf])(&local_b8,this_00,struct_def);
  std::operator+(&local_d8,"Offset<",&local_b8);
  std::operator+(&returns,&local_d8,'>');
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&field_vec,&(struct_def->fields).vec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"builder: FlatBufferBuilder",&local_d9);
  local_40.writer = writer;
  local_40.returns = &returns;
  local_40.field_vec = &field_vec;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateEndStructMethod(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_b8,&local_40);
  GenerateFun(writer,&name,&local_d8,&returns,(function<void_()> *)&local_b8,options->gen_jvmstatic)
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
  ~_Vector_base(&field_vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               );
  std::__cxx11::string::~string((string *)&returns);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void GenerateEndStructMethod(StructDef &struct_def, CodeWriter &writer,
                               const IDLOptions options) const {
    // Generate end{{TableName}}(builder: FlatBufferBuilder) method
    auto name = namer_.Method("end", struct_def.name);
    auto params = "builder: FlatBufferBuilder";
    auto returns = "Offset<" + namer_.Type(struct_def) + '>';
    auto field_vec = struct_def.fields.vec;

    GenerateFun(
        writer, name, params, returns,
        [&]() {
          writer += "val o: " + returns + " = builder.endTable()";
          writer.IncrementIdentLevel();
          for (auto it = field_vec.begin(); it != field_vec.end(); ++it) {
            auto &field = **it;
            if (field.deprecated || !field.IsRequired()) { continue; }
            writer.SetValue("offset", NumToString(field.value.offset));
            writer.SetValue("field_name", field.name);
            writer += "builder.required(o, {{offset}}, \"{{field_name}}\")";
          }
          writer.DecrementIdentLevel();
          writer += "return o";
        },
        options.gen_jvmstatic);
  }